

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::ProcessEdgesAtTopOfScanbeam(Clipper *this,cInt topY)

{
  double dVar1;
  TEdge *pTVar2;
  long lVar3;
  long lVar4;
  IntPoint OffPt;
  MaximaList *this_00;
  bool bVar5;
  cInt cVar6;
  OutPt *pOVar7;
  OutPt *pOVar8;
  TEdge *pTVar9;
  TEdge *e;
  IntPoint pt3;
  IntPoint pt3_00;
  IntPoint pt;
  TEdge *local_58;
  MaximaList *local_50;
  IntPoint local_48;
  
  pTVar9 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
  local_50 = &this->m_Maxima;
  while( true ) {
    this_00 = local_50;
    pTVar2 = pTVar9->NextInAEL;
    local_58 = pTVar2;
    if (pTVar2 == (TEdge *)0x0) break;
    if ((pTVar2->Top).Y == topY) {
      if (pTVar2->NextInLML != (TEdge *)0x0) {
LAB_0027b3d9:
        if (((pTVar2->NextInLML == (TEdge *)0x0) || (dVar1 = pTVar2->NextInLML->Dx, dVar1 != -1e+40)
            ) || (NAN(dVar1))) goto LAB_0027b440;
        ClipperBase::UpdateEdgeIntoAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   &local_58);
        pTVar9 = local_58;
        if (-1 < local_58->OutIdx) {
          AddOutPt(this,local_58,&local_58->Bot);
        }
        pTVar2 = this->m_SortedEdges;
        pTVar9->PrevInSEL = (TEdge *)0x0;
        if (pTVar2 != (TEdge *)0x0) {
          pTVar2->PrevInSEL = pTVar9;
        }
        this->m_SortedEdges = pTVar9;
        pTVar9->NextInSEL = pTVar2;
        goto LAB_0027b453;
      }
      pTVar9 = GetMaximaPairEx(pTVar2);
      if (((pTVar9 != (TEdge *)0x0) && (pTVar9->Dx == -1e+40)) && (!NAN(pTVar9->Dx)))
      goto LAB_0027b3d9;
      if (this->m_StrictSimple == true) {
        std::__cxx11::list<long_long,_std::allocator<long_long>_>::push_back
                  (local_50,&(pTVar2->Top).X);
      }
      pTVar9 = pTVar2->PrevInAEL;
      DoMaxima(this,pTVar2);
      if (pTVar9 == (TEdge *)0x0) {
        pTVar9 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
      }
    }
    else {
LAB_0027b440:
      cVar6 = TopX(pTVar2,topY);
      (pTVar2->Curr).X = cVar6;
      (pTVar2->Curr).Y = topY;
      pTVar9 = pTVar2;
LAB_0027b453:
      if (((this->m_StrictSimple == true) && (-1 < pTVar9->OutIdx)) &&
         ((pTVar2 = pTVar9->PrevInAEL, pTVar2 != (TEdge *)0x0 && pTVar9->WindDelta != 0 &&
          (((-1 < pTVar2->OutIdx && ((pTVar2->Curr).X == (pTVar9->Curr).X)) &&
           (pTVar2->WindDelta != 0)))))) {
        local_48.X = (pTVar9->Curr).X;
        local_48.Y = (pTVar9->Curr).Y;
        pOVar7 = AddOutPt(this,pTVar2,&local_48);
        pOVar8 = AddOutPt(this,pTVar9,&local_48);
        OffPt.Y = local_48.Y;
        OffPt.X = local_48.X;
        AddJoin(this,pOVar7,pOVar8,OffPt);
      }
    }
  }
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::sort(local_50);
  ProcessHorizontals(this);
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::clear(this_00);
  pTVar9 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
LAB_0027b580:
  do {
    pTVar9 = pTVar9->NextInAEL;
    if (pTVar9 == (TEdge *)0x0) {
      return;
    }
  } while (((pTVar9->Top).Y != topY) || (pTVar9->NextInLML == (TEdge *)0x0));
  local_58 = pTVar9;
  if (pTVar9->OutIdx < 0) {
    pOVar7 = (OutPt *)0x0;
  }
  else {
    pOVar7 = AddOutPt(this,pTVar9,&pTVar9->Top);
  }
  ClipperBase::UpdateEdgeIntoAEL
            ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),&local_58);
  pTVar9 = local_58;
  pTVar2 = local_58->NextInAEL;
  e = local_58->PrevInAEL;
  if ((((e == (TEdge *)0x0) || (lVar3 = (e->Curr).X, lVar3 != (local_58->Bot).X)) ||
      (pOVar7 == (OutPt *)0x0)) ||
     (((lVar4 = (e->Curr).Y, lVar4 != (local_58->Bot).Y || (e->OutIdx < 0)) || (lVar4 <= (e->Top).Y)
      ))) goto LAB_0027b65a;
  pt3.Y = lVar4;
  pt3.X = lVar3;
  bVar5 = SlopesEqual(local_58->Curr,local_58->Top,pt3,e->Top,
                      (bool)(this->_vptr_Clipper[-3] + 8)
                            [(long)&(this->m_GhostJoins).
                                    super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                            ]);
  if (((!bVar5) || (pTVar9->WindDelta == 0)) || (e->WindDelta == 0)) goto LAB_0027b65a;
  goto LAB_0027b6f5;
LAB_0027b65a:
  if ((((pTVar2 != (TEdge *)0x0) && (lVar3 = (pTVar2->Curr).X, lVar3 == (pTVar9->Bot).X)) &&
      (pOVar7 != (OutPt *)0x0)) &&
     (((lVar4 = (pTVar2->Curr).Y, lVar4 == (pTVar9->Bot).Y && (-1 < pTVar2->OutIdx)) &&
      ((pTVar2->Top).Y < lVar4)))) {
    pt3_00.Y = lVar4;
    pt3_00.X = lVar3;
    bVar5 = SlopesEqual(pTVar9->Curr,pTVar9->Top,pt3_00,pTVar2->Top,
                        (bool)(this->_vptr_Clipper[-3] + 8)
                              [(long)&(this->m_GhostJoins).
                                      super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                              ]);
    if (((bVar5) && (pTVar9->WindDelta != 0)) && (e = pTVar2, pTVar2->WindDelta != 0)) {
LAB_0027b6f5:
      pOVar8 = AddOutPt(this,e,&pTVar9->Bot);
      AddJoin(this,pOVar7,pOVar8,pTVar9->Top);
    }
  }
  goto LAB_0027b580;
}

Assistant:

void Clipper::ProcessEdgesAtTopOfScanbeam(const cInt topY)
{
  TEdge* e = m_ActiveEdges;
  while( e )
  {
    //1. process maxima, treating them as if they're 'bent' horizontal edges,
    //   but exclude maxima with horizontal edges. nb: e can't be a horizontal.
    bool IsMaximaEdge = IsMaxima(e, topY);

    if(IsMaximaEdge)
    {
      TEdge* eMaxPair = GetMaximaPairEx(e);
      IsMaximaEdge = (!eMaxPair || !IsHorizontal(*eMaxPair));
    }

    if(IsMaximaEdge)
    {
      if (m_StrictSimple) m_Maxima.push_back(e->Top.X);
      TEdge* ePrev = e->PrevInAEL;
      DoMaxima(e);
      if( !ePrev ) e = m_ActiveEdges;
      else e = ePrev->NextInAEL;
    }
    else
    {
      //2. promote horizontal edges, otherwise update Curr.X and Curr.Y ...
      if (IsIntermediate(e, topY) && IsHorizontal(*e->NextInLML))
      {
        UpdateEdgeIntoAEL(e);
        if (e->OutIdx >= 0)
          AddOutPt(e, e->Bot);
        AddEdgeToSEL(e);
      } 
      else
      {
        e->Curr.X = TopX( *e, topY );
        e->Curr.Y = topY;
#ifdef use_xyz
		e->Curr.Z = topY == e->Top.Y ? e->Top.Z : (topY == e->Bot.Y ? e->Bot.Z : 0);
#endif
	  }

      //When StrictlySimple and 'e' is being touched by another edge, then
      //make sure both edges have a vertex here ...
      if (m_StrictSimple)
      {  
        TEdge* ePrev = e->PrevInAEL;
        if ((e->OutIdx >= 0) && (e->WindDelta != 0) && ePrev && (ePrev->OutIdx >= 0) &&
          (ePrev->Curr.X == e->Curr.X) && (ePrev->WindDelta != 0))
        {
          IntPoint pt = e->Curr;
#ifdef use_xyz
          SetZ(pt, *ePrev, *e);
#endif
          OutPt* op = AddOutPt(ePrev, pt);
          OutPt* op2 = AddOutPt(e, pt);
          AddJoin(op, op2, pt); //StrictlySimple (type-3) join
        }
      }

      e = e->NextInAEL;
    }
  }

  //3. Process horizontals at the Top of the scanbeam ...
  m_Maxima.sort();
  ProcessHorizontals();
  m_Maxima.clear();

  //4. Promote intermediate vertices ...
  e = m_ActiveEdges;
  while(e)
  {
    if(IsIntermediate(e, topY))
    {
      OutPt* op = 0;
      if( e->OutIdx >= 0 ) 
        op = AddOutPt(e, e->Top);
      UpdateEdgeIntoAEL(e);

      //if output polygons share an edge, they'll need joining later ...
      TEdge* ePrev = e->PrevInAEL;
      TEdge* eNext = e->NextInAEL;
      if (ePrev && ePrev->Curr.X == e->Bot.X &&
        ePrev->Curr.Y == e->Bot.Y && op &&
        ePrev->OutIdx >= 0 && ePrev->Curr.Y > ePrev->Top.Y &&
        SlopesEqual(e->Curr, e->Top, ePrev->Curr, ePrev->Top, m_UseFullRange) &&
        (e->WindDelta != 0) && (ePrev->WindDelta != 0))
      {
        OutPt* op2 = AddOutPt(ePrev, e->Bot);
        AddJoin(op, op2, e->Top);
      }
      else if (eNext && eNext->Curr.X == e->Bot.X &&
        eNext->Curr.Y == e->Bot.Y && op &&
        eNext->OutIdx >= 0 && eNext->Curr.Y > eNext->Top.Y &&
        SlopesEqual(e->Curr, e->Top, eNext->Curr, eNext->Top, m_UseFullRange) &&
        (e->WindDelta != 0) && (eNext->WindDelta != 0))
      {
        OutPt* op2 = AddOutPt(eNext, e->Bot);
        AddJoin(op, op2, e->Top);
      }
    }
    e = e->NextInAEL;
  }
}